

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

int lodepng_color_mode_equal(LodePNGColorMode *a,LodePNGColorMode *b)

{
  size_t i;
  LodePNGColorMode *b_local;
  LodePNGColorMode *a_local;
  int local_4;
  
  if (a->colortype == b->colortype) {
    if (a->bitdepth == b->bitdepth) {
      if (a->key_defined == b->key_defined) {
        if (a->key_defined != 0) {
          if (a->key_r != b->key_r) {
            return 0;
          }
          if (a->key_g != b->key_g) {
            return 0;
          }
          if (a->key_b != b->key_b) {
            return 0;
          }
        }
        if (a->palettesize == b->palettesize) {
          for (i = 0; i != a->palettesize << 2; i = i + 1) {
            if (a->palette[i] != b->palette[i]) {
              return 0;
            }
          }
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int lodepng_color_mode_equal(const LodePNGColorMode* a, const LodePNGColorMode* b) {
  size_t i;
  if (a->colortype != b->colortype) return 0;
  if (a->bitdepth != b->bitdepth) return 0;
  if (a->key_defined != b->key_defined) return 0;
  if (a->key_defined) {
    if (a->key_r != b->key_r) return 0;
    if (a->key_g != b->key_g) return 0;
    if (a->key_b != b->key_b) return 0;
  }
  if (a->palettesize != b->palettesize) return 0;
  for (i = 0; i != a->palettesize * 4; ++i) {
    if (a->palette[i] != b->palette[i]) return 0;
  }
  return 1;
}